

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::FunctionArgument::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionArgument *this,int level)

{
  bool bVar1;
  pointer pEVar2;
  ulong uVar3;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [55];
  allocator local_41;
  undefined1 local_40 [8];
  string value;
  int level_local;
  FunctionArgument *this_local;
  
  value.field_2._12_4_ = level;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"null",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->default_value);
  if (bVar1) {
    pEVar2 = std::
             unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
             ::operator->(&this->default_value);
    (*(pEVar2->super_Statement).super_ASTElement._vptr_ASTElement[3])
              (local_78,pEVar2,(ulong)(value.field_2._12_4_ + 1));
    std::__cxx11::string::operator=((string *)local_40,local_78);
    std::__cxx11::string::~string(local_78);
  }
  uVar3 = (ulong)(int)value.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,uVar3,'\t',&local_f9);
  std::operator+(&local_d8,&local_f8,"FunctionArgument: ");
  std::operator+(&local_b8,&local_d8,&this->name);
  std::operator+(&local_98,&local_b8," = ");
  std::operator+(__return_storage_ptr__,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionArgument::dump(int level) const {
    std::string value {"null"};
    if (this->default_value) {
        value = this->default_value->dump(level+1);
    }
    return std::string(level, '\t')+ "FunctionArgument: "+this->name + " = "+ value;
}